

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O0

void test_accept_bind_address(void)

{
  cio_address_family family;
  cio_error cVar1;
  undefined1 local_5c8 [4];
  cio_error err;
  cio_server_socket ss;
  cio_eventloop loop;
  cio_socket_address endpoint;
  
  accept4_fake.custom_fake = custom_accept_fake;
  accept_handler_fake.custom_fake = accept_handler_close_server_socket;
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  fill_inet_socket_address((cio_socket_address *)((long)&loop.epoll_events[99].data + 4));
  family = cio_socket_address_get_family
                     ((cio_socket_address *)((long)&loop.epoll_events[99].data + 4));
  cVar1 = cio_server_socket_init
                    ((cio_server_socket *)local_5c8,(cio_eventloop *)&ss.free_client,5,family,
                     alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x14b,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_set_reuse_address((cio_server_socket *)local_5c8,true);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x14d,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_bind
                    ((cio_server_socket *)local_5c8,
                     (cio_socket_address *)((long)&loop.epoll_events[99].data + 4));
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x150,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_accept((cio_server_socket *)local_5c8,accept_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x153,UNITY_DISPLAY_STYLE_INT);
  (*(code *)ss.impl.close_timeout_ns)(ss.impl.ev.write_callback,0);
  UnityAssertEqualNumber
            (1,(ulong)accept_handler_fake.call_count,(char *)0x0,0x157,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_close_fake.call_count,(char *)0x0,0x158,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)local_5c8,(UNITY_INT)on_close_fake.arg0_val,(char *)0x0,0x159,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_accept_bind_address(void)
{
	accept4_fake.custom_fake = custom_accept_fake;
	accept_handler_fake.custom_fake = accept_handler_close_server_socket;
	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	struct cio_socket_address endpoint;
	fill_inet_socket_address(&endpoint);

	struct cio_eventloop loop;
	struct cio_server_socket ss;
	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, cio_socket_address_get_family(&endpoint), alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	err = cio_server_socket_set_reuse_address(&ss, true);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_server_socket_bind(&ss, &endpoint);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_server_socket_accept(&ss, accept_handler, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	ss.impl.ev.read_callback(ss.impl.ev.context, CIO_EPOLL_SUCCESS);

	TEST_ASSERT_EQUAL(1, accept_handler_fake.call_count);
	TEST_ASSERT_EQUAL(1, on_close_fake.call_count);
	TEST_ASSERT_EQUAL(&ss, on_close_fake.arg0_val);
}